

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O0

set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
* __thiscall dg::llvmdg::legacy::Function::condNodes(Function *this)

{
  iterator iVar1;
  iterator iVar2;
  iterator in_RDI;
  insert_iterator<std::set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
  iVar3;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *condNodes_;
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  *in_stack_ffffffffffffff88;
  undefined8 local_38;
  undefined8 local_30;
  
  std::
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::set((set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
         *)0x21af8f);
  iVar1 = std::
          set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
          ::begin(in_stack_ffffffffffffff88);
  iVar2 = std::
          set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
          ::end(in_stack_ffffffffffffff88);
  std::
  set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::end(in_stack_ffffffffffffff88);
  iVar3 = std::
          inserter<std::set<dg::llvmdg::legacy::Block*,std::less<dg::llvmdg::legacy::Block*>,std::allocator<dg::llvmdg::legacy::Block*>>>
                    (in_stack_ffffffffffffff88,in_RDI);
  local_38 = iVar3.container;
  local_30 = iVar3.iter._M_node;
  std::
  copy_if<std::_Rb_tree_const_iterator<dg::llvmdg::legacy::Block*>,std::insert_iterator<std::set<dg::llvmdg::legacy::Block*,std::less<dg::llvmdg::legacy::Block*>,std::allocator<dg::llvmdg::legacy::Block*>>>,dg::llvmdg::legacy::Function::condNodes()const::__0>
            (iVar1._M_node,iVar2._M_node,local_38,local_30);
  return (set<dg::llvmdg::legacy::Block_*,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
          *)in_RDI._M_node;
}

Assistant:

std::set<Block *> Function::condNodes() const {
    std::set<Block *> condNodes_;

    std::copy_if(
            blocks.begin(), blocks.end(),
            std::inserter(condNodes_, condNodes_.end()),
            [](const Block *block) { return block->successors().size() > 1; });

    return condNodes_;
}